

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gb_Apu.cpp
# Opt level: O0

void __thiscall Gb_Apu::Gb_Apu(Gb_Apu *this)

{
  Gb_Osc *pGVar1;
  Gb_Apu *in_RDI;
  Gb_Osc *osc;
  int i;
  double in_stack_ffffffffffffffd8;
  int local_c;
  
  Blip_Synth<12,_1>::Blip_Synth((Blip_Synth<12,_1> *)0x81d30f);
  Blip_Synth<8,_1>::Blip_Synth((Blip_Synth<8,_1> *)0x81d320);
  (in_RDI->square1).synth = &in_RDI->square_synth;
  (in_RDI->square2).synth = &in_RDI->square_synth;
  (in_RDI->wave).synth = &in_RDI->other_synth;
  (in_RDI->noise).synth = &in_RDI->other_synth;
  in_RDI->oscs[0] = (Gb_Osc *)&in_RDI->square1;
  in_RDI->oscs[1] = (Gb_Osc *)&in_RDI->square2;
  in_RDI->oscs[2] = &(in_RDI->wave).super_Gb_Osc;
  in_RDI->oscs[3] = (Gb_Osc *)&in_RDI->noise;
  for (local_c = 0; local_c < 4; local_c = local_c + 1) {
    pGVar1 = in_RDI->oscs[local_c];
    pGVar1->regs = in_RDI->regs + local_c * 5;
    pGVar1->output = (Blip_Buffer *)0x0;
    pGVar1->outputs[0] = (Blip_Buffer *)0x0;
    pGVar1->outputs[1] = (Blip_Buffer *)0x0;
    pGVar1->outputs[2] = (Blip_Buffer *)0x0;
    pGVar1->outputs[3] = (Blip_Buffer *)0x0;
  }
  set_tempo(in_RDI,1.0);
  volume(in_RDI,in_stack_ffffffffffffffd8);
  reset(in_RDI);
  return;
}

Assistant:

Gb_Apu::Gb_Apu()
{
	square1.synth = &square_synth;
	square2.synth = &square_synth;
	wave.synth  = &other_synth;
	noise.synth = &other_synth;
	
	oscs [0] = &square1;
	oscs [1] = &square2;
	oscs [2] = &wave;
	oscs [3] = &noise;
	
	for ( int i = 0; i < osc_count; i++ )
	{
		Gb_Osc& osc = *oscs [i];
		osc.regs = &regs [i * 5];
		osc.output = 0;
		osc.outputs [0] = 0;
		osc.outputs [1] = 0;
		osc.outputs [2] = 0;
		osc.outputs [3] = 0;
	}
	
	set_tempo( 1.0 );
	volume( 1.0 );
	reset();
}